

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O1

void __thiscall
Args::Command::checkCorrectnessBeforeParsing(Command *this,StringList *flags,StringList *names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer puVar4;
  ArgIface *pAVar5;
  _Alloc_hider _Var6;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  int iVar7;
  long lVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  logic_error *plVar10;
  long *plVar11;
  ulong *puVar12;
  size_type sVar13;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  pointer puVar14;
  bool bVar15;
  StringList ftmp;
  StringList ntmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [32];
  ulong *local_a0;
  long local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  StringList *local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = flags;
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_e0,this);
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
  if (local_e0._M_string_length == 0) {
    bVar15 = false;
  }
  else {
    if ((details::isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_ == '\0')
       && (iVar7 = __cxa_guard_acquire(&details::isCorrectName(std::__cxx11::string_const&)::
                                        availableSymbols_abi_cxx11_), iVar7 != 0)) {
      details::isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_._0_8_ =
           0x15a0b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 details::isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                 "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-_","");
      __cxa_atexit(std::__cxx11::string::~string,
                   details::isCorrectName(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&details::isCorrectName(std::__cxx11::string_const&)::
                           availableSymbols_abi_cxx11_);
    }
    _Var6._M_p = local_e0._M_dataplus._M_p;
    bVar15 = local_e0._M_string_length == 0;
    if ((!bVar15) &&
       (lVar8 = std::__cxx11::string::find(-0x60,(ulong)(uint)(int)*local_e0._M_dataplus._M_p),
       lVar8 != -1)) {
      sVar13 = 1;
      do {
        bVar15 = local_e0._M_string_length == sVar13;
        if (bVar15) break;
        lVar8 = std::__cxx11::string::find(-0x60,(ulong)(uint)(int)_Var6._M_p[sVar13]);
        sVar13 = sVar13 + 1;
      } while (lVar8 != -1);
    }
  }
  paVar1 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = local_58;
  if (!bVar15) {
    plVar10 = (logic_error *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Disallowed name \"","");
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_50,this);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_50);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_e0);
    local_a0 = (ulong *)*plVar11;
    puVar12 = (ulong *)(plVar11 + 2);
    if (local_a0 == puVar12) {
      local_90 = *puVar12;
      uStack_88 = plVar11[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *puVar12;
    }
    local_98 = plVar11[1];
    *plVar11 = (long)puVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::logic_error::logic_error(plVar10,"Please use desc() method of the exception.");
    *(undefined ***)plVar10 = &PTR__BaseException_00158940;
    *(logic_error **)(plVar10 + 0x10) = plVar10 + 0x20;
    if (local_a0 == &local_90) {
      *(undefined4 *)(plVar10 + 0x20) = (undefined4)local_90;
      *(undefined4 *)(plVar10 + 0x24) = local_90._4_4_;
      *(undefined4 *)(plVar10 + 0x28) = (undefined4)uStack_88;
      *(undefined4 *)(plVar10 + 0x2c) = uStack_88._4_4_;
    }
    else {
      *(ulong **)(plVar10 + 0x10) = local_a0;
      *(ulong *)(plVar10 + 0x20) = local_90;
    }
    *(long *)(plVar10 + 0x18) = local_98;
    local_98 = 0;
    local_90 = local_90 & 0xffffffffffffff00;
    local_a0 = &local_90;
    __cxa_throw(plVar10,&BaseException::typeinfo,BaseException::~BaseException);
  }
  uVar2 = *(undefined8 *)local_58;
  uVar3 = *(undefined8 *)(local_58 + 8);
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_e0,this);
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (uVar2,uVar3,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (_Var9._M_current !=
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this_00 + 8)) {
    plVar10 = (logic_error *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"Redefinition of command with name \"","");
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_50,this);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_50);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_e0);
    local_80 = (ulong *)*plVar11;
    puVar12 = (ulong *)(plVar11 + 2);
    if (local_80 == puVar12) {
      local_70 = *puVar12;
      uStack_68 = plVar11[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *puVar12;
    }
    local_78 = plVar11[1];
    *plVar11 = (long)puVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::logic_error::logic_error(plVar10,"Please use desc() method of the exception.");
    *(undefined ***)plVar10 = &PTR__BaseException_00158940;
    *(logic_error **)(plVar10 + 0x10) = plVar10 + 0x20;
    if (local_80 == &local_70) {
      *(undefined4 *)(plVar10 + 0x20) = (undefined4)local_70;
      *(undefined4 *)(plVar10 + 0x24) = local_70._4_4_;
      *(undefined4 *)(plVar10 + 0x28) = (undefined4)uStack_68;
      *(undefined4 *)(plVar10 + 0x2c) = uStack_68._4_4_;
    }
    else {
      *(ulong **)(plVar10 + 0x10) = local_80;
      *(ulong *)(plVar10 + 0x20) = local_70;
    }
    *(long *)(plVar10 + 0x18) = local_78;
    local_78 = 0;
    local_70 = local_70 & 0xffffffffffffff00;
    local_80 = &local_70;
    __cxa_throw(plVar10,&BaseException::typeinfo,BaseException::~BaseException);
  }
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_e0,this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_e0,local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  puVar14 = (this->super_GroupIface).m_children.
            super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar14 != puVar4) {
    do {
      pAVar5 = (puVar14->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
      (*pAVar5->_vptr_ArgIface[0x10])(pAVar5,&local_e0,local_c0);
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e0);
  return;
}

Assistant:

void checkCorrectnessBeforeParsing(
		//! All known flags.
		StringList & flags,
		//! All known names.
		StringList & names ) const override
	{
		if( details::isCorrectName( name() ) )
		{
			auto it = std::find( names.begin(), names.end(), name() );

			if( it != names.end() )
				throw BaseException( String( SL( "Redefinition of command "
					"with name \"" ) ) + name() + SL( "\"." ) );
			else
				names.push_back( name() );
		}
		else
			throw BaseException( String( SL( "Disallowed name \"" ) ) +
				name() + SL( "\" for the command." ) );

		StringList ftmp = flags;
		StringList ntmp = names;

		GroupIface::checkCorrectnessBeforeParsing( ftmp, ntmp );
	}